

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x1_010.c
# Opt level: O3

void seta_sound_w(void *chip,UINT16 offset,UINT8 data)

{
  ulong uVar1;
  undefined6 in_register_00000032;
  ulong uVar2;
  
  uVar1 = CONCAT62(in_register_00000032,offset) & 0xffffffff;
  if ((((offset & 0xff87) == 0) && ((data & 1) != 0)) &&
     ((*(byte *)((long)chip + uVar1 + 0x34) & 1) == 0)) {
    uVar2 = CONCAT62(in_register_00000032,offset) >> 3 & 0x1fffffff;
    *(undefined4 *)((long)chip + uVar2 * 4 + 0x2034) = 0;
    *(undefined4 *)((long)chip + uVar2 * 4 + 0x2074) = 0;
  }
  *(UINT8 *)((long)chip + uVar1 + 0x34) = data;
  return;
}

Assistant:

static void seta_sound_w(void *chip, UINT16 offset, UINT8 data)
{
	x1_010_state *info = (x1_010_state *)chip;
	int channel, reg;
	//offset ^= info->adr;

	channel = offset/sizeof(X1_010_CHANNEL);
	reg     = offset%sizeof(X1_010_CHANNEL);

	if( channel < SETA_NUM_CHANNELS && reg == 0
		&& (info->reg[offset]&1) == 0 && (data&1) != 0 ) {
		info->smp_offset[channel] = 0;
		info->env_offset[channel] = 0;
	}
	//LOG_REGISTER_WRITE(("%s: offset %6X : data %2X\n", machine().describe_context(), offset, data ));
	info->reg[offset] = data;
}